

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O0

Image * operator+(Image *__return_storage_ptr__,Image *image1,Image *image2)

{
  long lVar1;
  Image *image;
  int in_ECX;
  void *in_R8;
  int local_40;
  int local_3c;
  int j;
  int i;
  Image result;
  Image *image2_local;
  Image *image1_local;
  
  result.matrix = (int **)image2;
  Image::clone((Image *)&j,(__fn *)image1,image2,in_ECX,in_R8);
  for (local_3c = 0; local_3c < image1->row; local_3c = local_3c + 1) {
    for (local_40 = 0; local_40 < image1->col; local_40 = local_40 + 1) {
      lVar1 = *(long *)(result._8_8_ + (long)local_3c * 8);
      *(int *)(lVar1 + (long)local_40 * 4) =
           *(int *)(*(long *)(result.matrix[2] + (long)local_3c * 2) + (long)local_40 * 4) +
           *(int *)(lVar1 + (long)local_40 * 4);
    }
  }
  image = Image::normalize((Image *)&j);
  Image::Image(__return_storage_ptr__,image);
  Image::~Image((Image *)&j);
  return __return_storage_ptr__;
}

Assistant:

Image operator+(Image& image1, Image& image2)
{
    Image result = image1.clone();

    for (int i = 0; i < image1.row; ++i) {
        for (int j = 0; j < image1.col; ++j) {
            result.matrix[i][j] += image2.matrix[i][j];
        }
    }

    return result.normalize();
}